

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O1

void __thiscall Net::fit(Net *this,Table *samp,Table *ans,int global_iterations,int shott)

{
  Table *this_00;
  pointer pvVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  int iVar2;
  int iVar3;
  size_t __i;
  long lVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  double dVar8;
  double dVar9;
  mt19937 rnd;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  this->shot = shott;
  local_13b8._M_x[0] = 0x4b;
  lVar4 = 1;
  uVar5 = 0x4b;
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4);
    local_13b8._M_x[lVar4] = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_13b8._M_p = 0x270;
  iVar2 = Table::get_cols(ans);
  if (iVar2 == 1) {
    iVar2 = Table::get_cols(samp);
    pvVar1 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)*(pointer *)
               ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + 8) -
        *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data >> 3 == (long)iVar2) {
      dVar8 = Table::get_max(ans,0);
      dVar9 = Table::get_min(ans,0);
      pvVar1 = (this->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((int)((dVar8 - dVar9) + 1.0) ==
          (int)((ulong)((long)pvVar1[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)pvVar1[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3)) {
        this_00 = &this->samples;
        iVar2 = samp->rows;
        (this->samples).cols = samp->cols;
        (this->samples).rows = iVar2;
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
        ::operator=(&(this->samples).columns,&samp->columns);
        std::
        vector<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::operator=(&(this->samples).int_cols,&samp->int_cols);
        std::
        vector<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator=(&(this->samples).float_cols,&samp->float_cols);
        std::
        vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator=(&(this->samples).string_cols,&samp->string_cols);
        iVar2 = ans->rows;
        (this->answers).cols = ans->cols;
        (this->answers).rows = iVar2;
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
        ::operator=(&(this->answers).columns,&ans->columns);
        std::
        vector<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::operator=(&(this->answers).int_cols,&ans->int_cols);
        std::
        vector<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator=(&(this->answers).float_cols,&ans->float_cols);
        std::
        vector<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator=(&(this->answers).string_cols,&ans->string_cols);
        iVar2 = Table::get_cols(this_00);
        if (0 < iVar2) {
          iVar2 = 0;
          do {
            dVar8 = Table::get_max(this_00,iVar2);
            if (dVar8 <= 1.0) {
              dVar8 = 1.0;
            }
            Table::divide_column(this_00,iVar2,dVar8);
            iVar2 = iVar2 + 1;
            iVar3 = Table::get_cols(this_00);
          } while (iVar2 < iVar3);
        }
        iVar2 = Table::get_rows(this_00);
        std::vector<int,_std::allocator<int>_>::resize(&this->shuffler,(long)iVar2);
        __first._M_current =
             (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        __last._M_current =
             (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        lVar4 = (long)__last._M_current - (long)__first._M_current;
        if (lVar4 != 0) {
          lVar4 = lVar4 >> 2;
          lVar6 = 0;
          do {
            __first._M_current[lVar6] = (int)lVar6;
            lVar6 = lVar6 + 1;
          } while (lVar4 + (ulong)(lVar4 == 0) != lVar6);
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                  (__first,__last,&local_13b8);
        if (this->shot == 0) {
          dVar8 = log((double)(int)((ulong)((long)(this->shuffler).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->shuffler).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
          iVar2 = 2;
          if (2 < (int)dVar8 / 10) {
            iVar2 = (int)dVar8 / 10;
          }
          this->shot = iVar2;
        }
        learn(this,global_iterations);
        return;
      }
      pcVar7 = "Incorrect output data\n";
    }
    else {
      pcVar7 = "Incorrect input data\n";
    }
  }
  else {
    pcVar7 = "Output table has more than 1 column\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar7);
  exit(1);
}

Assistant:

void Net::fit(Table &samp, Table &ans, int global_iterations, int shott){
    shot = shott;
    std::mt19937 rnd(75);
    if (ans.get_cols() != 1){
        std::cerr << "Output table has more than 1 column\n";
        exit(EXIT_FAILURE);
    }
    if (samp.get_cols() != mesh[0].size()){
        std::cerr << "Incorrect input data\n";
        exit(EXIT_FAILURE);
    }
    if ((int)(ans.get_max(0)-ans.get_min(0) + 1) != (int)mesh.back().size()){
        std::cerr << "Incorrect output data\n";
        exit(EXIT_FAILURE);
    }

    samples = samp;
    answers = ans;
    for (int i = 0; i < samples.get_cols(); ++i)
        samples.divide_column(i, std::max(1.0, samples.get_max(i)));

    // creating shuffler
    shuffler.resize(samples.get_rows());
    for (int i = 0; i < shuffler.size(); ++i)
        shuffler[i] = i;
    std::shuffle(shuffler.begin(), shuffler.end(), rnd);
    if (shot == 0) shot = std::max((int)log((int)shuffler.size())/10, 2);
    learn(global_iterations);
}